

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

void vkt::api::anon_unknown_0::createFormatTests(TestCaseGroup *testGroup)

{
  char *__s;
  VkFormat value;
  allocator<char> local_91;
  string local_90;
  string caseName;
  string local_50 [32];
  
  for (value = VK_FORMAT_R4G4_UNORM_PACK8;
      value != (VK_FORMAT_ASTC_12x12_SRGB_BLOCK|VK_FORMAT_R4G4_UNORM_PACK8);
      value = value + VK_FORMAT_R4G4_UNORM_PACK8) {
    __s = ::vk::getFormatName(value);
    std::__cxx11::string::string<std::allocator<char>>(local_50,__s,&local_91);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)local_50);
    de::toLower(&caseName,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,__s,(allocator<char> *)local_50);
    addFunctionCase<vk::VkFormat>(testGroup,&caseName,&local_90,formatProperties,value);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&caseName);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&caseName,"depth_stencil",(allocator<char> *)local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  addFunctionCase(testGroup,&caseName,&local_90,testDepthStencilSupported);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&caseName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&caseName,"compressed_formats",(allocator<char> *)local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  addFunctionCase(testGroup,&caseName,&local_90,testCompressedFormatsSupported);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&caseName);
  return;
}

Assistant:

void createFormatTests (tcu::TestCaseGroup* testGroup)
{
	DE_STATIC_ASSERT(VK_FORMAT_UNDEFINED == 0);

	for (deUint32 formatNdx = VK_FORMAT_UNDEFINED+1; formatNdx < VK_CORE_FORMAT_LAST; ++formatNdx)
	{
		const VkFormat		format			= (VkFormat)formatNdx;
		const char* const	enumName		= getFormatName(format);
		const string		caseName		= de::toLower(string(enumName).substr(10));

		addFunctionCase(testGroup, caseName, enumName, formatProperties, format);
	}

	addFunctionCase(testGroup, "depth_stencil",			"",	testDepthStencilSupported);
	addFunctionCase(testGroup, "compressed_formats",	"",	testCompressedFormatsSupported);
}